

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O1

void write_delta_q_params(AV1_COMMON *cm,MACROBLOCKD *xd,int skip,aom_writer *w)

{
  od_ec_enc *enc;
  aom_cdf_prob *icdf;
  uint8_t uVar1;
  ushort uVar2;
  ushort uVar3;
  MB_MODE_INFO *pMVar4;
  FRAME_CONTEXT *pFVar5;
  uint uVar6;
  short sVar7;
  byte bVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  FRAME_CONTEXT *in_R9;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  bool bVar15;
  
  if ((cm->delta_q_info).delta_q_present_flag != 0) {
    pMVar4 = *xd->mi;
    uVar11 = cm->seq_params->mib_size - 1;
    if ((xd->mi_row & uVar11) == 0) {
      bVar15 = (xd->mi_col & uVar11) == 0;
    }
    else {
      bVar15 = false;
    }
    if ((skip == 0 || pMVar4->bsize != cm->seq_params->sb_size) && (bVar15)) {
      uVar12 = (long)(pMVar4->current_qindex - xd->current_base_qindex) /
               (long)(cm->delta_q_info).delta_q_res;
      uVar11 = (uint)uVar12;
      uVar10 = (ulong)-uVar11;
      if (0 < (int)uVar11) {
        uVar10 = uVar12 & 0xffffffff;
      }
      pFVar5 = xd->tile_ctx;
      uVar9 = (uint)uVar10;
      uVar12 = 3;
      if (uVar9 < 3) {
        uVar12 = uVar10;
      }
      icdf = pFVar5->delta_q_cdf;
      enc = &w->ec;
      od_ec_encode_cdf_q15(enc,(int)uVar12,icdf,4);
      if (w->allow_update_cdf != '\0') {
        uVar2 = pFVar5->delta_q_cdf[4];
        bVar8 = (char)(uVar2 >> 4) + 5;
        uVar10 = 0;
        do {
          uVar3 = icdf[uVar10];
          if (uVar10 < uVar12) {
            sVar7 = (short)((int)(0x8000 - (uint)uVar3) >> (bVar8 & 0x1f));
          }
          else {
            sVar7 = -(uVar3 >> (bVar8 & 0x1f));
          }
          icdf[uVar10] = sVar7 + uVar3;
          uVar10 = uVar10 + 1;
        } while (uVar10 != 3);
        pFVar5->delta_q_cdf[4] = pFVar5->delta_q_cdf[4] + (ushort)(uVar2 < 0x20);
        in_R9 = pFVar5;
      }
      if (2 < uVar9) {
        uVar6 = 0x1f;
        if (uVar9 - 1 != 0) {
          for (; uVar9 - 1 >> uVar6 == 0; uVar6 = uVar6 - 1) {
          }
        }
        uVar14 = 4;
        do {
          od_ec_encode_bool_q15
                    (enc,(uint)((0x1e - (uVar6 ^ 0x1f) >> (uVar14 - 2 & 0x1f) & 1) != 0),0x4000);
          uVar14 = uVar14 - 1;
        } while (1 < uVar14);
        bVar8 = (byte)uVar6 & 0x1f;
        if (uVar6 != 0) {
          iVar13 = uVar6 + 1;
          do {
            od_ec_encode_bool_q15
                      (enc,(uint)((uVar9 + (-2 << bVar8 | 0xfffffffeU >> 0x20 - bVar8) >>
                                   (iVar13 - 2U & 0x1f) & 1) != 0),0x4000);
            iVar13 = iVar13 + -1;
          } while (1 < iVar13);
        }
      }
      if (uVar11 != 0) {
        od_ec_encode_bool_q15(enc,uVar11 >> 0x1f,0x4000);
      }
      xd->current_base_qindex = pMVar4->current_qindex;
      if ((cm->delta_q_info).delta_lf_present_flag != 0) {
        if ((cm->delta_q_info).delta_lf_multi == 0) {
          write_delta_lflevel((AV1_COMMON *)xd,(MACROBLOCKD *)0xffffffff,
                              ((int)pMVar4->delta_lf_from_base - (int)xd->delta_lf_from_base) /
                              (cm->delta_q_info).delta_lf_res,0,(int)w,(aom_writer *)in_R9);
          xd->delta_lf_from_base = pMVar4->delta_lf_from_base;
        }
        else {
          uVar1 = cm->seq_params->monochrome;
          uVar12 = 0;
          do {
            write_delta_lflevel((AV1_COMMON *)xd,(MACROBLOCKD *)(uVar12 & 0xffffffff),
                                ((int)pMVar4->delta_lf[uVar12] - (int)xd->delta_lf[uVar12]) /
                                (cm->delta_q_info).delta_lf_res,1,(int)w,(aom_writer *)in_R9);
            xd->delta_lf[uVar12] = pMVar4->delta_lf[uVar12];
            uVar12 = uVar12 + 1;
          } while ((ulong)(uVar1 == '\0') * 2 + 2 != uVar12);
        }
      }
    }
  }
  return;
}

Assistant:

static inline void write_delta_q_params(AV1_COMMON *const cm,
                                        MACROBLOCKD *const xd, int skip,
                                        aom_writer *w) {
  const DeltaQInfo *const delta_q_info = &cm->delta_q_info;

  if (delta_q_info->delta_q_present_flag) {
    const MB_MODE_INFO *const mbmi = xd->mi[0];
    const BLOCK_SIZE bsize = mbmi->bsize;
    const int super_block_upper_left =
        ((xd->mi_row & (cm->seq_params->mib_size - 1)) == 0) &&
        ((xd->mi_col & (cm->seq_params->mib_size - 1)) == 0);

    if ((bsize != cm->seq_params->sb_size || skip == 0) &&
        super_block_upper_left) {
      assert(mbmi->current_qindex > 0);
      const int reduced_delta_qindex =
          (mbmi->current_qindex - xd->current_base_qindex) /
          delta_q_info->delta_q_res;
      write_delta_qindex(xd, reduced_delta_qindex, w);
      xd->current_base_qindex = mbmi->current_qindex;
      if (delta_q_info->delta_lf_present_flag) {
        if (delta_q_info->delta_lf_multi) {
          const int frame_lf_count =
              av1_num_planes(cm) > 1 ? FRAME_LF_COUNT : FRAME_LF_COUNT - 2;
          for (int lf_id = 0; lf_id < frame_lf_count; ++lf_id) {
            int reduced_delta_lflevel =
                (mbmi->delta_lf[lf_id] - xd->delta_lf[lf_id]) /
                delta_q_info->delta_lf_res;
            write_delta_lflevel(cm, xd, lf_id, reduced_delta_lflevel, 1, w);
            xd->delta_lf[lf_id] = mbmi->delta_lf[lf_id];
          }
        } else {
          int reduced_delta_lflevel =
              (mbmi->delta_lf_from_base - xd->delta_lf_from_base) /
              delta_q_info->delta_lf_res;
          write_delta_lflevel(cm, xd, -1, reduced_delta_lflevel, 0, w);
          xd->delta_lf_from_base = mbmi->delta_lf_from_base;
        }
      }
    }
  }
}